

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

void * __thiscall
kj::anon_unknown_35::InMemoryFile::mmap
          (InMemoryFile *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  Impl *pIVar1;
  MmapDisposer *this_00;
  uchar *puVar2;
  undefined4 in_register_0000000c;
  Own<const_kj::(anonymous_namespace)::InMemoryFile> local_68;
  MmapDisposer *local_58;
  ArrayDisposer *disposer;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_30;
  Fault f;
  uint64_t size_local;
  uint64_t offset_local;
  InMemoryFile *this_local;
  
  f.exception = (Exception *)CONCAT44(in_register_0000000c,__prot);
  if (__len <= (long)(f.exception)->trace + (__len - 0x50)) {
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&disposer);
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&disposer);
    Impl::ensureCapacity(pIVar1,(long)(f.exception)->trace + (__len - 0x50));
    this_00 = (MmapDisposer *)operator_new(0x18);
    atomicAddRef<kj::(anonymous_namespace)::InMemoryFile>((kj *)&local_68,(InMemoryFile *)__addr);
    MmapDisposer::MmapDisposer(this_00,&local_68);
    Own<const_kj::(anonymous_namespace)::InMemoryFile>::~Own(&local_68);
    local_58 = this_00;
    pIVar1 = Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                       ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&disposer);
    puVar2 = Array<unsigned_char>::begin(&pIVar1->bytes);
    Array<const_unsigned_char>::Array
              ((Array<const_unsigned_char> *)this,puVar2 + __len,(size_t)f.exception,
               &local_58->super_ArrayDisposer);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
              ((Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&disposer);
    return this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x328,FAILED,"offset + size >= offset","\"mmap() request overflows uint64\"",
             (char (*) [32])"mmap() request overflows uint64");
  _::Debug::Fault::fatal(&local_30);
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const override {
    KJ_REQUIRE(offset + size >= offset, "mmap() request overflows uint64");
    auto lock = impl.lockExclusive();
    lock->ensureCapacity(offset + size);

    ArrayDisposer* disposer = new MmapDisposer(atomicAddRef(*this));
    return Array<const byte>(lock->bytes.begin() + offset, size, *disposer);
  }